

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getTemperature(Thermo *this)

{
  int iVar1;
  SnapshotManager *this_00;
  Snapshot *this_01;
  undefined8 *in_RDI;
  SimInfo *this_02;
  RealType RVar2;
  double dVar3;
  RealType temperature;
  RealType nuclearKE;
  Snapshot *snap;
  Thermo *in_stack_00000060;
  Thermo *in_stack_000001f0;
  RealType local_20;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  this_01 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((this_01->hasTemperature & 1U) == 0) {
    this_02 = (SimInfo *)getTranslationalKinetic(in_stack_00000060);
    RVar2 = getRotationalKinetic(in_stack_000001f0);
    dVar3 = (double)this_02 + RVar2;
    iVar1 = SimInfo::getNdf(this_02);
    if (iVar1 < 1) {
      local_20 = 0.0;
    }
    else {
      iVar1 = SimInfo::getNdf(this_02);
      local_20 = (dVar3 * 2.0) / ((double)iVar1 * 0.0019872156);
    }
    Snapshot::setTemperature(this_01,local_20);
  }
  RVar2 = Snapshot::getTemperature(this_01);
  return RVar2;
}

Assistant:

RealType Thermo::getTemperature() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTemperature) {
      RealType nuclearKE =
          this->getTranslationalKinetic() + this->getRotationalKinetic();

      RealType temperature {};

      // With no degrees of freedom, T is not well defined, but we'll
      // set to zero.

      if (info_->getNdf() > 0)
        temperature = (2.0 * nuclearKE) / (info_->getNdf() * Constants::kb);
      else
        temperature = 0.0;

      snap->setTemperature(temperature);
    }

    return snap->getTemperature();
  }